

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,LogFormat *logFormat)

{
  LogFormat *logFormat_local;
  LogFormat *this_local;
  
  Loggable::Loggable(&this->super_Loggable);
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0028fdb0;
  std::__cxx11::string::string((string *)&this->m_userFormat);
  std::__cxx11::string::string((string *)&this->m_format);
  std::__cxx11::string::string((string *)&this->m_dateTimeFormat);
  std::__cxx11::string::string((string *)&this->m_currentUser);
  std::__cxx11::string::string((string *)&this->m_currentHost);
  this->m_level = logFormat->m_level;
  std::__cxx11::string::operator=((string *)&this->m_userFormat,(string *)&logFormat->m_userFormat);
  std::__cxx11::string::operator=((string *)&this->m_format,(string *)&logFormat->m_format);
  std::__cxx11::string::operator=
            ((string *)&this->m_dateTimeFormat,(string *)&logFormat->m_dateTimeFormat);
  this->m_flags = logFormat->m_flags;
  std::__cxx11::string::operator=
            ((string *)&this->m_currentUser,(string *)&logFormat->m_currentUser);
  std::__cxx11::string::operator=
            ((string *)&this->m_currentHost,(string *)&logFormat->m_currentHost);
  return;
}

Assistant:

LogFormat::LogFormat(LogFormat&& logFormat) {
  m_level = std::move(logFormat.m_level);
  m_userFormat = std::move(logFormat.m_userFormat);
  m_format = std::move(logFormat.m_format);
  m_dateTimeFormat = std::move(logFormat.m_dateTimeFormat);
  m_flags = std::move(logFormat.m_flags);
  m_currentUser = std::move(logFormat.m_currentUser);
  m_currentHost = std::move(logFormat.m_currentHost);
}